

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# impute.hpp
# Opt level: O0

void allocate_imp_vec<ImputedData<long,double>,InputData<double,long>>
               (vector<ImputedData<long,_double>,_std::allocator<ImputedData<long,_double>_>_>
                *impute_vec,InputData<double,_long> *input_data,int nthreads)

{
  reference pvVar1;
  long in_RSI;
  vector<ImputedData<long,_double>,_std::allocator<ImputedData<long,_double>_>_> *in_RDI;
  vector<ImputedData<long,_double>,_std::allocator<ImputedData<long,_double>_>_> *unaff_retaddr;
  size_t row;
  size_t in_stack_00000060;
  InputData<double,_long> *in_stack_00000068;
  ImputedData<long,_double> *in_stack_00000070;
  undefined8 local_20;
  
  std::vector<ImputedData<long,_double>,_std::allocator<ImputedData<long,_double>_>_>::resize
            (unaff_retaddr,(size_type)in_RDI);
  for (local_20 = 0; local_20 < *(ulong *)(in_RSI + 0x30); local_20 = local_20 + 1) {
    pvVar1 = std::vector<char,_std::allocator<char>_>::operator[]
                       ((vector<char,_std::allocator<char>_> *)(in_RSI + 0x98),local_20);
    if (*pvVar1 != '\0') {
      std::vector<ImputedData<long,_double>,_std::allocator<ImputedData<long,_double>_>_>::
      operator[](in_RDI,local_20);
      initialize_impute_calc<ImputedData<long,double>,InputData<double,long>>
                (in_stack_00000070,in_stack_00000068,in_stack_00000060);
    }
  }
  return;
}

Assistant:

void allocate_imp_vec(std::vector<ImputedData> &impute_vec, InputData &input_data, int nthreads)
{
    impute_vec.resize(input_data.nrows);
    #pragma omp parallel for schedule(dynamic) num_threads(nthreads) shared(impute_vec, input_data)
    for (size_t_for row = 0; row < (decltype(row))input_data.nrows; row++)
        if (input_data.has_missing[row])
            initialize_impute_calc(impute_vec[row], input_data, row);
}